

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_MNDX.cpp
# Opt level: O2

int __thiscall
TFileNameDatabase::SetChildDatabase(TFileNameDatabase *this,TFileNameDatabase *pNewDB)

{
  TFileNameDatabase *this_00;
  int iVar1;
  
  this_00 = this->pChildDB;
  if (pNewDB == (TFileNameDatabase *)0x0 || this_00 != pNewDB) {
    if (this_00 != (TFileNameDatabase *)0x0) {
      ~TFileNameDatabase(this_00);
      operator_delete(this_00,0x248);
    }
    this->pChildDB = pNewDB;
    iVar1 = 0;
  }
  else {
    iVar1 = 0x16;
  }
  return iVar1;
}

Assistant:

int SetChildDatabase(TFileNameDatabase * pNewDB)
    {
        if(pNewDB != NULL && pChildDB == pNewDB)
            return ERROR_INVALID_PARAMETER;

        if(pChildDB != NULL)
            delete pChildDB;
        pChildDB = pNewDB;
        return ERROR_SUCCESS;
    }